

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferPoolTest.cpp
# Opt level: O3

void __thiscall
BufferPool_FreeBuffersAndBackingMemory_Test::TestBody
          (BufferPool_FreeBuffersAndBackingMemory_Test *this)

{
  bool bVar1;
  FreeNode *pFVar2;
  bool bVar3;
  long lVar4;
  BufferPool local_48;
  
  memt::BufferPool::BufferPool(&local_48,5);
  bVar1 = true;
  do {
    bVar3 = bVar1;
    memt::BufferPool::freeAllBuffersAndBackingMemory(&local_48);
    lVar4 = 100;
    do {
      if (local_48._free == (FreeNode *)0x0) {
        if (local_48._blocks._block._position == local_48._blocks._block._end) {
          memt::BufferPool::growCapacity(&local_48);
          pFVar2 = local_48._free;
        }
        else {
          pFVar2 = (FreeNode *)0x0;
        }
        local_48._free = (FreeNode *)local_48._blocks._block._position;
        local_48._blocks._block._position =
             (char *)((long)&((FreeNode *)local_48._blocks._block._position)->next +
                     local_48._bufferSize);
      }
      else {
        pFVar2 = (local_48._free)->next;
      }
      (local_48._free)->next = pFVar2;
      lVar4 = lVar4 + -1;
      local_48._free = pFVar2;
    } while (lVar4 != 0);
    memt::BufferPool::freeAllBuffersAndBackingMemory(&local_48);
    bVar1 = false;
  } while (bVar3);
  memt::MemoryBlocks::freeAllBlocks(&local_48._blocks);
  return;
}

Assistant:

TEST(BufferPool, FreeBuffersAndBackingMemory) {
  memt::BufferPool pool(5);
  for (size_t j = 0; j < 2; ++j) {
    pool.freeAllBuffersAndBackingMemory();
    for (size_t i = 0; i < 100; ++i) {
      pool.free(pool.alloc());
      pool.alloc();
    }
    pool.freeAllBuffersAndBackingMemory();
  }
}